

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O1

void __thiscall chrono::fea::ChExtruderBeamEuler::Update(ChExtruderBeamEuler *this)

{
  ChCoordsys<double> *this_00;
  double dVar1;
  pointer psVar2;
  element_type *peVar3;
  ChMesh *pCVar4;
  element_type *peVar5;
  element_type *peVar6;
  ChLinkMotorLinearSpeed *this_01;
  ChContactSurfaceNodeCloud *this_02;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ChNodeFEAxyzrot *this_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_04;
  ChCoordsys<double> *mc;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> node0;
  ChCoordsys<double> C0;
  ChCoordsys<double> C0_ref;
  shared_ptr<chrono::fea::ChElementBeamEuler> element;
  ChVector<double> v;
  ChVector<double> P1;
  value_type local_410;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_400;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> local_3f8;
  element_type *local_3e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3e0;
  ChNodeFEAxyzrot *local_3d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3d0;
  shared_ptr<chrono::fea::ChElementBase> local_3c8;
  ChBodyFrame *local_3b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3b0;
  undefined1 *local_3a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3a0;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_398;
  ChCoordsys<double> local_388;
  element_type *local_348;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_340;
  shared_ptr<chrono::ChFunction> local_338;
  ChCoordsys<double> local_328;
  ChFrame<double> local_2f0;
  ChFrame<double> local_268;
  ChVector<double> local_1e0;
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  psVar2 = (this->beam_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  peVar3 = psVar2[-1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_04 = psVar2[-1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_04 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_04->_M_use_count = this_04->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_04->_M_use_count = this_04->_M_use_count + 1;
    }
  }
  local_1e0.m_data[0] = *(double *)&(peVar3->super_ChNodeFEAbase).field_0x20;
  local_1e0.m_data[1] = *(double *)&peVar3->field_0x28;
  local_1e0.m_data[2] = *(double *)&peVar3->field_0x30;
  this_00 = &this->outlet;
  ChCoordsys<double>::TransformParentToLocal(this_00,&local_1e0);
  if (0.0 <= (double)local_2f0._vptr_ChFrame) {
    local_268.coord.pos.m_data[1] = (double)local_2f0._vptr_ChFrame - this->h;
    local_388.pos.m_data[2] = 0.0;
    local_388.pos.m_data[0] = 0.0;
    local_388.pos.m_data[1] = 0.0;
    local_388.rot.m_data[0] = 1.0;
    local_388.rot.m_data[1] = 0.0;
    local_388.rot.m_data[2] = 0.0;
    local_388.rot.m_data[3] = 0.0;
    if (&(this->outlet).rot != &local_388.rot) {
      local_388.rot.m_data[0] = (this->outlet).rot.m_data[0];
      local_388.rot.m_data[1] = (this->outlet).rot.m_data[1];
      local_388.rot.m_data[2] = (this->outlet).rot.m_data[2];
      local_388.rot.m_data[3] = (this->outlet).rot.m_data[3];
    }
    local_268._vptr_ChFrame = (_func_int **)(local_268.coord.pos.m_data[1] * VECT_X);
    local_268.coord.pos.m_data[0] = local_268.coord.pos.m_data[1] * DAT_00b90ad8;
    local_268.coord.pos.m_data[1] = local_268.coord.pos.m_data[1] * DAT_00b90ae0;
    local_400 = this_04;
    ChCoordsys<double>::TransformLocalToParent(this_00,(ChVector<double> *)&local_268);
    local_388.pos.m_data[0] = (this->outlet).pos.m_data[0] + (double)local_2f0._vptr_ChFrame;
    local_388.pos.m_data[1] = (this->outlet).pos.m_data[1] + local_2f0.coord.pos.m_data[0];
    local_388.pos.m_data[2] = (this->outlet).pos.m_data[2] + local_2f0.coord.pos.m_data[1];
    local_328.rot.m_data[0] = 1.0;
    local_328.rot.m_data[1] = 0.0;
    local_328.rot.m_data[2] = 0.0;
    local_328.rot.m_data[3] = 0.0;
    if (&(peVar3->X0).coord.rot != &local_328.rot) {
      local_328.rot.m_data[0] = (peVar3->X0).coord.rot.m_data[0];
      local_328.rot.m_data[1] = (peVar3->X0).coord.rot.m_data[1];
      local_328.rot.m_data[2] = (peVar3->X0).coord.rot.m_data[2];
      local_328.rot.m_data[3] = (peVar3->X0).coord.rot.m_data[3];
    }
    dVar1 = this->h;
    local_328.pos.m_data[0] = (peVar3->X0).coord.pos.m_data[0] - dVar1 * VECT_X;
    local_328.pos.m_data[1] = (peVar3->X0).coord.pos.m_data[1] - dVar1 * DAT_00b90ad8;
    local_328.pos.m_data[2] = (peVar3->X0).coord.pos.m_data[2] - dVar1 * DAT_00b90ae0;
    mc = &local_388;
    ChFrame<double>::ChFrame(&local_268,mc);
    this_03 = (ChNodeFEAxyzrot *)ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)mc);
    local_2f0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
    local_2f0.coord.pos.m_data[0] = local_268.coord.pos.m_data[0];
    local_2f0.coord.pos.m_data[1] = local_268.coord.pos.m_data[1];
    local_2f0.coord.pos.m_data[2] = local_268.coord.pos.m_data[2];
    local_2f0.coord.rot.m_data[0] = local_268.coord.rot.m_data[0];
    local_2f0.coord.rot.m_data[1] = local_268.coord.rot.m_data[1];
    local_2f0.coord.rot.m_data[2] = local_268.coord.rot.m_data[2];
    local_2f0.coord.rot.m_data[3] = local_268.coord.rot.m_data[3];
    local_2f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_268.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_2f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         local_268.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_2f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_268.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_2f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_268.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_2f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_268.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_2f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_268.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    local_2f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_268.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    local_2f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_268.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    local_2f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_268.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    ChNodeFEAxyzrot::ChNodeFEAxyzrot(this_03,&local_2f0);
    local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this_03;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
              (&local_410.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,this_03);
    peVar7 = local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_268.coord.pos.m_data[1] = this->speed;
    local_268._vptr_ChFrame = (_func_int **)(local_268.coord.pos.m_data[1] * VECT_X);
    local_268.coord.pos.m_data[0] = local_268.coord.pos.m_data[1] * DAT_00b90ad8;
    local_268.coord.pos.m_data[1] = local_268.coord.pos.m_data[1] * DAT_00b90ae0;
    ChCoordsys<double>::TransformDirectionLocalToParent(this_00,(ChVector<double> *)&local_268);
    (**(code **)(*(long *)&(peVar7->super_ChNodeFEAbase).field_0x18 + 0x38))
              (&(peVar7->super_ChNodeFEAbase).field_0x18,&local_2f0);
    this_04 = local_400;
    peVar7 = local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    ChFrame<double>::ChFrame(&local_b8,&local_328);
    ChFrame<double>::operator=(&peVar7->X0,&local_b8);
    pCVar4 = (this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_398.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &(local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->super_ChNodeFEAbase;
    local_398.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ChMesh::AddNode(pCVar4,&local_398);
    if (local_398.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_398.
                 super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::push_back(&this->beam_nodes,&local_410);
    peVar5 = (this->actuator).
             super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3a8 = &((local_410.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_ChNodeFEAbase).field_0x18;
    if (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (ChNodeFEAxyzrot *)0x0) {
      local_3a8 = (undefined1 *)0x0;
    }
    local_3a0 = local_410.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    peVar6 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3b8 = &peVar6->super_ChBodyFrame;
    if (peVar6 == (element_type *)0x0) {
      local_3b8 = (ChBodyFrame *)0x0;
    }
    local_3b0 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_3b0->_M_use_count = local_3b0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_3b0->_M_use_count = local_3b0->_M_use_count + 1;
      }
    }
    ChFrame<double>::ChFrame(&local_140,&local_388);
    ChFrame<double>::ChFrame(&local_1c8,&local_388);
    (**(code **)(*(long *)&(peVar5->super_ChLinkMotorLinear).super_ChLinkMotor.
                           super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink + 0x248))
              (peVar5,&local_3a8,&local_3b8,0,&local_140,&local_1c8);
    if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
    }
    if (local_3a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0);
    }
    this_01 = (this->actuator).
              super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_338.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
    (local_338.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count = 1;
    (local_338.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_weak_count = 1;
    (local_338.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
    local_338.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_338.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi + 1);
    dVar1 = this->speed;
    local_338.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
    *(double *)
     &local_338.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._M_use_count = dVar1;
    ChLinkMotorLinearSpeed::SetSpeedFunction(this_01,&local_338);
    if (local_338.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_338.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    peVar5 = (this->actuator).
             super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(double *)&(peVar5->super_ChLinkMotorLinear).field_0x278 =
         *(double *)&(peVar5->super_ChLinkMotorLinear).field_0x278 - this->h;
    local_2f0._vptr_ChFrame = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::fea::ChElementBeamEuler,std::allocator<chrono::fea::ChElementBeamEuler>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2f0.coord,
               (ChElementBeamEuler **)&local_2f0,
               (allocator<chrono::fea::ChElementBeamEuler> *)&local_268);
    pCVar4 = (this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_3c8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2f0._vptr_ChFrame;
    local_3c8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0.coord.pos.m_data[0];
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0.coord.pos.m_data[0] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)((long)local_2f0.coord.pos.m_data[0] + 8) =
             *(_Atomic_word *)((long)local_2f0.coord.pos.m_data[0] + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)((long)local_2f0.coord.pos.m_data[0] + 8) =
             *(_Atomic_word *)((long)local_2f0.coord.pos.m_data[0] + 8) + 1;
      }
    }
    ChMesh::AddElement(pCVar4,&local_3c8);
    if (local_3c8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3c8.
                 super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    vector<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
    ::push_back(&this->beam_elems,(value_type *)&local_2f0);
    local_3d8 = local_410.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3d0 = local_410.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_3e0 = this_04;
    if (this_04 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_04->_M_use_count = this_04->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_04->_M_use_count = this_04->_M_use_count + 1;
      }
    }
    local_3e8 = peVar3;
    (*(*(_func_int ***)local_2f0._vptr_ChFrame)[0x1a])
              (local_2f0._vptr_ChFrame,&local_3d8,&local_3e8);
    if (local_3e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e0);
    }
    if (local_3d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d0);
    }
    local_348 = (this->beam_section).
                super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    local_340._M_pi =
         (this->beam_section).
         super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
      }
    }
    ((element_type *)(local_2f0._vptr_ChFrame + 0x1a))->_vptr_ChElementBase =
         (_func_int **)local_348;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2f0._vptr_ChFrame + 0x1b),
               &local_340);
    if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_340._M_pi);
    }
    (*(*(_func_int ***)local_2f0._vptr_ChFrame)[0x15])(local_2f0._vptr_ChFrame,this->mysystem);
    this_02 = (this->contactcloud).
              super___shared_ptr<chrono::fea::ChContactSurfaceNodeCloud,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    if (this_02 != (ChContactSurfaceNodeCloud *)0x0) {
      local_3f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
      local_3f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_410.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_410.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChContactSurfaceNodeCloud::AddNode(this_02,&local_3f8,this->contact_radius);
      if (local_3f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3f8.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0.coord.pos.m_data[0] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0.coord.pos.m_data[0]);
    }
    if (local_410.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_410.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  this->mytime = this->mysystem->ch_time;
  if (this_04 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_04);
  }
  return;
}

Assistant:

void ChExtruderBeamEuler::Update() {
    auto node1 = beam_nodes.back();
    ChVector<> P1 = node1->GetPos();
    double d1 = (outlet.TransformParentToLocal(P1)).x();

    // GetLog() << " d1=" << d1 << "\n";

    if (d1 >= 0) {
        double d0 = d1 - this->h;
        ChCoordsys<> C0;
        C0.rot = outlet.rot;
        C0.pos = outlet.pos + outlet.TransformLocalToParent(VECT_X * d0);
        ChCoordsys<> C0_ref;
        C0_ref.rot = node1->GetX0().GetRot();
        C0_ref.pos = node1->GetX0().GetPos() - VECT_X * this->h;

        auto node0 = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(C0));
        node0->SetPos_dt(outlet.TransformDirectionLocalToParent(VECT_X * this->speed));
        node0->SetX0(ChFrame<>(C0_ref));
        mesh->AddNode(node0);
        beam_nodes.push_back(node0);

        actuator->Initialize(node0, ground, false, ChFrame<>(C0), ChFrame<>(C0));
        actuator->SetSpeedFunction(chrono_types::make_shared<ChFunction_Const>(this->speed));
        actuator->SetMotionOffset(actuator->GetMotionOffset() - this->h);
        /*
        actuator->Initialize(node0, ground, false, ChFrame<>(C0), ChFrame<>(C0));
        actuator->SetMotionFunction(chrono_types::make_shared<ChFunction_Ramp>(0,this->speed));
        actuator->SetMotionOffset(actuator->GetMotionOffset() - this->h);
        */
        auto element = chrono_types::make_shared<ChElementBeamEuler>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(node0, node1);

        element->SetSection(this->beam_section);

        element->SetupInitial(mysystem);

        // add collision model to node
        if (this->contactcloud) {
            contactcloud->AddNode(node0, this->contact_radius);
        }
    }
    mytime = mysystem->GetChTime();
}